

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

void UA_Client_Subscriptions_forceDelete(UA_Client *client,UA_Client_Subscription *sub)

{
  UA_Client_MonitoredItem *pUVar1;
  UA_Client_MonitoredItem *pUVar2;
  UA_Client_Subscription *pUVar3;
  UA_Client_MonitoredItem *__ptr;
  
  __ptr = (sub->monitoredItems).lh_first;
  while (__ptr != (UA_Client_MonitoredItem *)0x0) {
    pUVar1 = (__ptr->listEntry).le_next;
    deleteMembers_noInit(&__ptr->monitoredNodeId,UA_TYPES + 0x10);
    (__ptr->monitoredNodeId).namespaceIndex = 0;
    *(undefined2 *)&(__ptr->monitoredNodeId).field_0x2 = 0;
    (__ptr->monitoredNodeId).identifierType = UA_NODEIDTYPE_NUMERIC;
    (__ptr->monitoredNodeId).identifier.string.length = 0;
    (__ptr->monitoredNodeId).identifier.string.data = (UA_Byte *)0x0;
    pUVar2 = (__ptr->listEntry).le_next;
    if (pUVar2 != (UA_Client_MonitoredItem *)0x0) {
      (pUVar2->listEntry).le_prev = (__ptr->listEntry).le_prev;
    }
    *(__ptr->listEntry).le_prev = pUVar2;
    free(__ptr);
    __ptr = pUVar1;
  }
  pUVar3 = (sub->listEntry).le_next;
  if (pUVar3 != (UA_Client_Subscription *)0x0) {
    (pUVar3->listEntry).le_prev = (sub->listEntry).le_prev;
  }
  *(sub->listEntry).le_prev = pUVar3;
  free(sub);
  return;
}

Assistant:

void
UA_Client_Subscriptions_forceDelete(UA_Client *client,
                                    UA_Client_Subscription *sub) {
    UA_Client_MonitoredItem *mon, *mon_tmp;
    LIST_FOREACH_SAFE(mon, &sub->monitoredItems, listEntry, mon_tmp) {
        UA_NodeId_deleteMembers(&mon->monitoredNodeId);
        LIST_REMOVE(mon, listEntry);
        UA_free(mon);
    }
    LIST_REMOVE(sub, listEntry);
    UA_free(sub);
}